

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<QItemSelectionRange>::growAppend
          (QCommonArrayOps<QItemSelectionRange> *this,QItemSelectionRange *b,QItemSelectionRange *e)

{
  bool bVar1;
  QArrayDataPointer<QItemSelectionRange> *this_00;
  QCommonArrayOps<QItemSelectionRange> *in_RDX;
  QCommonArrayOps<QItemSelectionRange> *in_RSI;
  QItemSelectionRange *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QArrayDataPointer<QItemSelectionRange> *in_stack_ffffffffffffffa0;
  QGenericArrayOps<QItemSelectionRange> *in_stack_ffffffffffffffb0;
  GrowthPosition in_stack_ffffffffffffffbc;
  QItemSelectionRange *p;
  QArrayDataPointer<QItemSelectionRange> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    this_00 = (QArrayDataPointer<QItemSelectionRange> *)((long)in_RDX - (long)in_RSI >> 4);
    local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    p = in_RDI;
    QArrayDataPointer<QItemSelectionRange>::QArrayDataPointer(&local_28);
    bVar1 = q_points_into_range<QtPrivate::QCommonArrayOps<QItemSelectionRange>,QItemSelectionRange_const*>
                      ((QItemSelectionRange **)p,in_RDX);
    if (bVar1) {
      QArrayDataPointer<QItemSelectionRange>::detachAndGrow
                (this_00,in_stack_ffffffffffffffbc,(qsizetype)in_stack_ffffffffffffffb0,
                 (QItemSelectionRange **)in_RDI,in_stack_ffffffffffffffa0);
    }
    else {
      QArrayDataPointer<QItemSelectionRange>::detachAndGrow
                (this_00,in_stack_ffffffffffffffbc,(qsizetype)in_stack_ffffffffffffffb0,
                 (QItemSelectionRange **)in_RDI,in_stack_ffffffffffffffa0);
    }
    QGenericArrayOps<QItemSelectionRange>::copyAppend
              (in_stack_ffffffffffffffb0,in_RDI,(QItemSelectionRange *)in_stack_ffffffffffffffa0);
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }